

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

int cm_strverscmp(char *lhs,char *rhs)

{
  int iVar1;
  size_t i_00;
  size_t sVar2;
  size_t sVar3;
  size_t rhs_end;
  size_t lhs_end;
  size_t rhs_zeros;
  size_t lhs_zeros;
  size_t b;
  size_t i;
  char *rhs_local;
  char *lhs_local;
  
  i_00 = cm_strverscmp_find_first_difference_or_end(lhs,rhs);
  if ((lhs[i_00] != rhs[i_00]) &&
     ((sVar2 = cm_strverscmp_find_digits_begin(lhs,i_00), sVar2 != i_00 ||
      ((iVar1 = isdigit((int)lhs[i_00]), iVar1 != 0 && (iVar1 = isdigit((int)rhs[i_00]), iVar1 != 0)
       ))))) {
    sVar3 = cm_strverscmp_count_leading_zeros(lhs,sVar2);
    sVar2 = cm_strverscmp_count_leading_zeros(rhs,sVar2);
    if (sVar3 != sVar2) {
      if (sVar2 <= sVar3) {
        return -1;
      }
      return 1;
    }
    if (sVar3 == 0) {
      sVar2 = cm_strverscmp_find_digits_end(lhs,i_00);
      sVar3 = cm_strverscmp_find_digits_end(rhs,i_00);
      if (sVar2 != sVar3) {
        if (sVar2 <= sVar3) {
          return -1;
        }
        return 1;
      }
    }
  }
  return (int)lhs[i_00] - (int)rhs[i_00];
}

Assistant:

static int cm_strverscmp(const char* lhs, const char* rhs)
{
  size_t const i = cm_strverscmp_find_first_difference_or_end(lhs, rhs);
  if (lhs[i] != rhs[i]) {
    /* The strings differ starting at 'i'.  Check for a digit sequence.  */
    size_t const b = cm_strverscmp_find_digits_begin(lhs, i);
    if (b != i || (isdigit(lhs[i]) && isdigit(rhs[i]))) {
      /* A digit sequence starts at 'b', preceding or at 'i'.  */

      /* Look for leading zeros, implying a leading decimal point.  */
      size_t const lhs_zeros = cm_strverscmp_count_leading_zeros(lhs, b);
      size_t const rhs_zeros = cm_strverscmp_count_leading_zeros(rhs, b);
      if (lhs_zeros != rhs_zeros) {
        /* The side with more leading zeros orders first.  */
        return rhs_zeros > lhs_zeros ? 1 : -1;
      }
      if (lhs_zeros == 0) {
        /* No leading zeros; compare digit sequence lengths.  */
        size_t const lhs_end = cm_strverscmp_find_digits_end(lhs, i);
        size_t const rhs_end = cm_strverscmp_find_digits_end(rhs, i);
        if (lhs_end != rhs_end) {
          /* The side with fewer digits orders first.  */
          return lhs_end > rhs_end ? 1 : -1;
        }
      }
    }
  }

  /* Ordering was not decided by digit sequence lengths; compare bytes.  */
  return lhs[i] - rhs[i];
}